

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

node_t_conflict pre_left_op(c2m_ctx_t c2m_ctx,int token,int token2,_func_node_t_c2m_ctx_t *f)

{
  int iVar1;
  node_t_conflict op1;
  node_t_conflict op;
  node_code_t code;
  pos_t pos;
  node_code_t local_44;
  pos_t local_40;
  
  op1 = (*f)(c2m_ctx);
  if (op1 != (node_t_conflict)0x0) {
    while( true ) {
      iVar1 = pre_match((c2m_ctx_t)c2m_ctx->pre_ctx,token,&local_40,&local_44,(node_t_conflict *)0x0
                       );
      if (iVar1 == 0) {
        if (token2 < 0) {
          return op1;
        }
        iVar1 = pre_match((c2m_ctx_t)c2m_ctx->pre_ctx,token2,&local_40,&local_44,
                          (node_t_conflict *)0x0);
        if (iVar1 == 0) {
          return op1;
        }
      }
      op1 = new_pos_node1(c2m_ctx,local_44,local_40,op1);
      op = (*f)(c2m_ctx);
      if (op == (node_t_conflict)0x0) break;
      op_append(c2m_ctx,op1,op);
    }
  }
  return (node_t_conflict)0x0;
}

Assistant:

static node_t pre_left_op (c2m_ctx_t c2m_ctx, int token, int token2,
                           node_t (*f) (c2m_ctx_t c2m_ctx)) {
  node_code_t code;
  node_t r, n;
  pos_t pos;

  if ((r = f (c2m_ctx)) == NULL) return r;
  while (pre_match (c2m_ctx, token, &pos, &code, NULL)
         || (token2 >= 0 && pre_match (c2m_ctx, token2, &pos, &code, NULL))) {
    n = new_pos_node1 (c2m_ctx, code, pos, r);
    if ((r = f (c2m_ctx)) == NULL) return r;
    op_append (c2m_ctx, n, r);
    r = n;
  }
  return r;
}